

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O0

void Abc_ObjPatchFanin(Abc_Obj_t *pObj,Abc_Obj_t *pFaninOld,Abc_Obj_t *pFaninNew)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  int iFanin;
  Abc_Obj_t *pFaninNewR;
  Abc_Obj_t *pFaninNew_local;
  Abc_Obj_t *pFaninOld_local;
  Abc_Obj_t *pObj_local;
  
  pAVar3 = Abc_ObjRegular(pFaninNew);
  iVar1 = Abc_ObjIsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0xb0,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsComplement(pFaninOld);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pFaninOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0xb1,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pFaninOld == pAVar3) {
    __assert_fail("pFaninOld != pFaninNewR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0xb2,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pObj->pNtk == pFaninOld->pNtk) {
    if (pObj->pNtk == pAVar3->pNtk) {
      iVar1 = Vec_IntFind(&pObj->vFanins,pFaninOld->Id);
      if (iVar1 == -1) {
        pcVar4 = Abc_ObjName(pFaninOld);
        printf("Node %s is not among",pcVar4);
        pcVar4 = Abc_ObjName(pObj);
        printf(" the fanins of node %s...\n",pcVar4);
      }
      else {
        Vec_IntWriteEntry(&pObj->vFanins,iVar1,pAVar3->Id);
        iVar2 = Abc_ObjIsComplement(pFaninNew);
        if (iVar2 != 0) {
          Abc_ObjXorFaninC(pObj,iVar1);
        }
        iVar1 = Vec_IntRemove(&pFaninOld->vFanouts,pObj->Id);
        if (iVar1 == 0) {
          pcVar4 = Abc_ObjName(pObj);
          printf("Node %s is not among",pcVar4);
          pcVar4 = Abc_ObjName(pFaninOld);
          printf(" the fanouts of its old fanin %s...\n",pcVar4);
        }
        Vec_IntPushMem(pObj->pNtk->pMmStep,&pAVar3->vFanouts,pObj->Id);
      }
      return;
    }
    __assert_fail("pObj->pNtk == pFaninNewR->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0xb6,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  __assert_fail("pObj->pNtk == pFaninOld->pNtk",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                ,0xb5,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_ObjPatchFanin( Abc_Obj_t * pObj, Abc_Obj_t * pFaninOld, Abc_Obj_t * pFaninNew )
{
    Abc_Obj_t * pFaninNewR = Abc_ObjRegular(pFaninNew);
    int iFanin;//, nLats;//, fCompl;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( !Abc_ObjIsComplement(pFaninOld) );
    assert( pFaninOld != pFaninNewR );
//    assert( pObj != pFaninOld );
//    assert( pObj != pFaninNewR );
    assert( pObj->pNtk == pFaninOld->pNtk );
    assert( pObj->pNtk == pFaninNewR->pNtk );
    if ( (iFanin = Vec_IntFind( &pObj->vFanins, pFaninOld->Id )) == -1 )
    {
        printf( "Node %s is not among", Abc_ObjName(pFaninOld) );
        printf( " the fanins of node %s...\n", Abc_ObjName(pObj) );
        return;
    }

    // remember the attributes of the old fanin
//    fCompl = Abc_ObjFaninC(pObj, iFanin);
    // replace the old fanin entry by the new fanin entry (removes attributes)
    Vec_IntWriteEntry( &pObj->vFanins, iFanin, pFaninNewR->Id );
    // set the attributes of the new fanin
//    if ( fCompl ^ Abc_ObjIsComplement(pFaninNew) )
//        Abc_ObjSetFaninC( pObj, iFanin );
    if ( Abc_ObjIsComplement(pFaninNew) )
        Abc_ObjXorFaninC( pObj, iFanin );

//    if ( Abc_NtkIsSeq(pObj->pNtk) && (nLats = Seq_ObjFaninL(pObj, iFanin)) )
//        Seq_ObjSetFaninL( pObj, iFanin, nLats );
    // update the fanout of the fanin
    if ( !Vec_IntRemove( &pFaninOld->vFanouts, pObj->Id ) )
    {
        printf( "Node %s is not among", Abc_ObjName(pObj) );
        printf( " the fanouts of its old fanin %s...\n", Abc_ObjName(pFaninOld) );
//        return;
    }
    Vec_IntPushMem( pObj->pNtk->pMmStep, &pFaninNewR->vFanouts, pObj->Id );
}